

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O1

int __thiscall QtMWidgets::BusyIndicatorPrivate::init(BusyIndicatorPrivate *this,EVP_PKEY_CTX *ctx)

{
  BusyIndicator *pBVar1;
  undefined8 uVar2;
  ColorGroup CVar3;
  int iVar4;
  QVariantAnimation *pQVar5;
  undefined4 *puVar6;
  long *plVar7;
  QVariant local_68;
  QObject local_48 [8];
  code *local_40;
  ImplFn local_38;
  
  pQVar5 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar5,(QObject *)this->q);
  this->animation = pQVar5;
  QVariant::QVariant(&local_68,0.0);
  QVariantAnimation::setStartValue((QVariant *)pQVar5);
  QVariant::~QVariant(&local_68);
  pQVar5 = this->animation;
  QVariant::QVariant(&local_68,359.0);
  QVariantAnimation::setEndValue((QVariant *)pQVar5);
  QVariant::~QVariant(&local_68);
  QVariantAnimation::setDuration((int)this->animation);
  QAbstractAnimation::setLoopCount((int)this->animation);
  pBVar1 = this->q;
  pQVar5 = this->animation;
  local_68.d.data.shared = (PrivateShared *)QVariantAnimation::valueChanged;
  local_68.d.data._8_8_ = 0;
  local_40 = BusyIndicator::_q_update;
  local_38 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::BusyIndicator::*)(const_QVariant_&),_QtPrivate::List<const_QVariant_&>,_void>
       ::impl;
  *(code **)(puVar6 + 4) = BusyIndicator::_q_update;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar5,(QObject *)&local_68,(void **)pBVar1,
             (QSlotObjectBase *)&local_40,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  CVar3 = QWidget::palette();
  plVar7 = (long *)QPalette::brush(CVar3,Dark);
  uVar2 = *(undefined8 *)(*plVar7 + 0xe);
  *(undefined8 *)&this->color = *(undefined8 *)(*plVar7 + 8);
  *(undefined8 *)((long)&(this->color).ct + 2) = uVar2;
  iVar4 = QAbstractAnimation::start(this->animation,0);
  return iVar4;
}

Assistant:

void
BusyIndicatorPrivate::init()
{
	animation = new QVariantAnimation( q );
	animation->setStartValue( 0.0 );
	animation->setEndValue( 359.0 );
	animation->setDuration( 1000 );
	animation->setLoopCount( -1 );

	QObject::connect( animation, &QVariantAnimation::valueChanged,
		q, &BusyIndicator::_q_update );

	color = q->palette().color( QPalette::Highlight );

	animation->start();
}